

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape-description.cpp
# Opt level: O2

bool msdfgen::writeShapeDescription(FILE *output,Shape *shape)

{
  bool bVar1;
  bool bVar2;
  EdgeSegment *pEVar3;
  long lVar4;
  pointer pEVar5;
  uint __c;
  pointer pCVar6;
  const_iterator edge;
  pointer this;
  
  bVar2 = Shape::validate(shape);
  if (bVar2) {
    if (shape->inverseYAxis == true) {
      fwrite("@invert-y\n",10,1,(FILE *)output);
    }
    for (pCVar6 = (shape->contours).
                  super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar6 != (shape->contours).
                  super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                  super__Vector_impl_data._M_finish; pCVar6 = pCVar6 + 1) {
      fwrite("{\n",2,1,(FILE *)output);
      this = (pCVar6->edges).
             super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
             super__Vector_impl_data._M_start;
      pEVar5 = (pCVar6->edges).
               super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (this != pEVar5) {
        for (; this != pEVar5; this = this + 1) {
          pEVar3 = EdgeHolder::operator->(this);
          __c = 0;
          bVar1 = true;
          switch(pEVar3->color) {
          case YELLOW:
            __c = 0x79;
            break;
          default:
            goto switchD_0016665c_caseD_4;
          case MAGENTA:
            __c = 0x6d;
            break;
          case CYAN:
            __c = 99;
            break;
          case WHITE:
            __c = 0x77;
          }
          bVar1 = false;
switchD_0016665c_caseD_4:
          pEVar3 = EdgeHolder::operator*(this);
          lVar4 = __dynamic_cast(pEVar3,&EdgeSegment::typeinfo,&LinearSegment::typeinfo,0);
          if (lVar4 != 0) {
            fputc(9,(FILE *)output);
            writeCoord(output,*(Point2 *)(lVar4 + 0x10));
            fwrite(";\n",2,1,(FILE *)output);
            if (!bVar1) {
              fprintf((FILE *)output,"\t\t%c;\n",(ulong)__c);
            }
          }
          pEVar3 = EdgeHolder::operator*(this);
          lVar4 = __dynamic_cast(pEVar3,&EdgeSegment::typeinfo,&QuadraticSegment::typeinfo,0);
          if (lVar4 != 0) {
            fputc(9,(FILE *)output);
            writeCoord(output,*(Point2 *)(lVar4 + 0x10));
            fwrite(";\n\t\t",4,1,(FILE *)output);
            if (!bVar1) {
              fputc(__c,(FILE *)output);
            }
            fputc(0x28,(FILE *)output);
            writeCoord(output,*(Point2 *)(lVar4 + 0x20));
            fwrite(");\n",3,1,(FILE *)output);
          }
          pEVar3 = EdgeHolder::operator*(this);
          lVar4 = __dynamic_cast(pEVar3,&EdgeSegment::typeinfo,&CubicSegment::typeinfo,0);
          if (lVar4 != 0) {
            fputc(9,(FILE *)output);
            writeCoord(output,*(Point2 *)(lVar4 + 0x10));
            fwrite(";\n\t\t",4,1,(FILE *)output);
            if (!bVar1) {
              fputc(__c,(FILE *)output);
            }
            fputc(0x28,(FILE *)output);
            writeCoord(output,*(Point2 *)(lVar4 + 0x20));
            fwrite("; ",2,1,(FILE *)output);
            writeCoord(output,*(Point2 *)(lVar4 + 0x30));
            fwrite(");\n",3,1,(FILE *)output);
          }
          pEVar5 = (pCVar6->edges).
                   super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        fwrite("\t#\n",3,1,(FILE *)output);
      }
      fwrite("}\n",2,1,(FILE *)output);
    }
  }
  return bVar2;
}

Assistant:

bool writeShapeDescription(FILE *output, const Shape &shape) {
    if (!shape.validate())
        return false;
    if (shape.inverseYAxis)
        fprintf(output, "@invert-y\n");
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour) {
        fprintf(output, "{\n");
        if (!contour->edges.empty()) {
            for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                char colorCode = '\0';
                switch ((*edge)->color) {
                    case YELLOW: colorCode = 'y'; break;
                    case MAGENTA: colorCode = 'm'; break;
                    case CYAN: colorCode = 'c'; break;
                    case WHITE: colorCode = 'w'; break;
                    default: break;
                }
                {
                    const LinearSegment *e = dynamic_cast<const LinearSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n");
                        if (colorCode)
                            fprintf(output, "\t\t%c;\n", colorCode);
                    }
                }
                {
                    const QuadraticSegment *e = dynamic_cast<const QuadraticSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n\t\t");
                        if (colorCode)
                            fprintf(output, "%c", colorCode);
                        fprintf(output, "(");
                        writeCoord(output, e->p[1]);
                        fprintf(output, ");\n");
                    }
                }
                {
                    const CubicSegment *e = dynamic_cast<const CubicSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n\t\t");
                        if (colorCode)
                            fprintf(output, "%c", colorCode);
                        fprintf(output, "(");
                        writeCoord(output, e->p[1]);
                        fprintf(output, "; ");
                        writeCoord(output, e->p[2]);
                        fprintf(output, ");\n");
                    }
                }
            }
            fprintf(output, "\t#\n");
        }
        fprintf(output, "}\n");
    }
    return true;
}